

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Sequence::Sequence(Sequence *this,Sequence *rhs)

{
  byte_t *value;
  UL local_48;
  Sequence *local_18;
  Sequence *rhs_local;
  Sequence *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  StructuralComponent::StructuralComponent
            (&this->super_StructuralComponent,
             (rhs->super_StructuralComponent).super_InterchangeObject.m_Dict);
  (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Sequence_0033a320;
  Array<Kumu::UUID>::Array(&this->StructuralComponents);
  if ((this->super_StructuralComponent).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_StructuralComponent).super_InterchangeObject.m_Dict,
                           MDD_Sequence);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    (*(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
      [0x14])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x413,"ASDCP::MXF::Sequence::Sequence(const Sequence &)");
}

Assistant:

Sequence::Sequence(const Sequence& rhs) : StructuralComponent(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Sequence);
  Copy(rhs);
}